

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode req_assign_url_path(httpreq *req,CURLU *url)

{
  curl_strdup_callback p_Var1;
  CURLUcode CVar2;
  char *pcVar3;
  CURLcode local_50;
  CURLcode result;
  CURLUcode uc;
  dynbuf buf;
  char *query;
  char *path;
  CURLU *url_local;
  httpreq *req_local;
  
  local_50 = CURLE_URL_MALFORMAT;
  buf.toobig = 0;
  query = (char *)0x0;
  path = (char *)url;
  url_local = (CURLU *)req;
  Curl_dyn_init((dynbuf *)&result,0x100000);
  CVar2 = curl_url_get((CURLU *)path,CURLUPART_PATH,&query,0x10);
  if ((CVar2 != CURLUE_OK) ||
     ((CVar2 = curl_url_get((CURLU *)path,CURLUPART_QUERY,(char **)&buf.toobig,0),
      CVar2 != CURLUE_OK && (CVar2 != CURLUE_NO_QUERY)))) goto LAB_00153c32;
  if ((query == (char *)0x0) && (buf.toobig == 0)) {
    url_local[1].zoneid = (char *)0x0;
  }
  else if ((query == (char *)0x0) || (buf.toobig != 0)) {
    if (((query != (char *)0x0) &&
        (local_50 = Curl_dyn_add((dynbuf *)&result,query), local_50 != CURLE_OK)) ||
       ((buf.toobig != 0 &&
        (local_50 = Curl_dyn_addf((dynbuf *)&result,"?%s",buf.toobig), local_50 != CURLE_OK))))
    goto LAB_00153c32;
    p_Var1 = Curl_cstrdup;
    pcVar3 = Curl_dyn_ptr((dynbuf *)&result);
    pcVar3 = (*p_Var1)(pcVar3);
    url_local[1].zoneid = pcVar3;
    if (url_local[1].zoneid == (char *)0x0) goto LAB_00153c32;
  }
  else {
    url_local[1].zoneid = query;
    query = (char *)0x0;
  }
  local_50 = CURLE_OK;
LAB_00153c32:
  (*Curl_cfree)(query);
  (*Curl_cfree)((void *)buf.toobig);
  Curl_dyn_free((dynbuf *)&result);
  return local_50;
}

Assistant:

static CURLcode req_assign_url_path(struct httpreq *req, CURLU *url)
{
  char *path, *query;
  struct dynbuf buf;
  CURLUcode uc;
  CURLcode result = CURLE_URL_MALFORMAT;

  path = query = NULL;
  Curl_dyn_init(&buf, DYN_HTTP_REQUEST);

  uc = curl_url_get(url, CURLUPART_PATH, &path, CURLU_PATH_AS_IS);
  if(uc)
    goto out;
  uc = curl_url_get(url, CURLUPART_QUERY, &query, 0);
  if(uc && uc != CURLUE_NO_QUERY)
    goto out;

  if(!path && !query) {
    req->path = NULL;
  }
  else if(path && !query) {
    req->path = path;
    path = NULL;
  }
  else {
    if(path) {
      result = Curl_dyn_add(&buf, path);
      if(result)
        goto out;
    }
    if(query) {
      result = Curl_dyn_addf(&buf, "?%s", query);
      if(result)
        goto out;
    }
    req->path = strdup(Curl_dyn_ptr(&buf));
    if(!req->path)
      goto out;
  }
  result = CURLE_OK;

out:
  free(path);
  free(query);
  Curl_dyn_free(&buf);
  return result;
}